

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBytecodeGenerator::EnterEvalStackScope(WasmBytecodeGenerator *this,BlockInfo *blockInfo)

{
  uint uVar1;
  uint32 uVar2;
  EmitInfo local_30;
  uint local_28;
  WasmType local_24;
  uint32 i;
  BlockInfo *local_18;
  BlockInfo *blockInfo_local;
  WasmBytecodeGenerator *this_local;
  
  local_24 = Limit;
  local_18 = blockInfo;
  blockInfo_local = (BlockInfo *)this;
  EmitInfo::EmitInfo((EmitInfo *)&i,&local_24);
  JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Push
            (&this->m_evalStack,(EmitInfo *)&i);
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    uVar2 = PolymorphicEmitInfo::Count(&local_18->paramInfo);
    if (uVar2 <= uVar1) break;
    local_30 = PolymorphicEmitInfo::GetInfo(&local_18->paramInfo,local_28);
    JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Push
              (&this->m_evalStack,&local_30);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::EnterEvalStackScope(const BlockInfo* blockInfo)
{
    m_evalStack.Push(EmitInfo(WasmTypes::Limit));
    // Push the in-params of the block upon entering the scope
    for (uint32 i = 0; i < blockInfo->paramInfo.Count(); ++i)
    {
        m_evalStack.Push(blockInfo->paramInfo.GetInfo(i));
    }
}